

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weight_constraint.cpp
# Opt level: O3

WeightLitsRep *
Clasp::WeightLitsRep::create
          (WeightLitsRep *__return_storage_ptr__,Solver *s,WeightLitVec *lits,weight_t bound)

{
  uint *puVar1;
  pointer puVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  ulong uVar5;
  pair<Clasp::Literal,_int> *ppVar6;
  pointer ppVar7;
  int iVar8;
  ulong uVar9;
  char *exp;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  size_type sVar13;
  uint uVar14;
  uint uVar15;
  char *fmt;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar22;
  pair<Clasp::Literal,_int> *__last;
  _Temporary_buffer<std::pair<Clasp::Literal,_int>_*,_std::pair<Clasp::Literal,_int>_> local_48;
  long lVar19;
  
  if (((s->assign_).assign_.ebo_.size - 1 < (s->shared_->varInfo_).ebo_.size - 1) &&
     (uVar5 = (ulong)(lits->ebo_).size, uVar5 != 0)) {
    ppVar7 = (lits->ebo_).buf;
    ppVar6 = std::__max_element<std::pair<Clasp::Literal,int>*,__gnu_cxx::__ops::_Iter_less_iter>
                       (ppVar7,ppVar7 + uVar5);
    Solver::acquireProblemVar(s,(ppVar6->first).rep_ >> 2);
  }
  if ((lits->ebo_).size == 0) {
LAB_001793ec:
    uVar12 = 0;
LAB_001793ef:
    sVar13 = 0;
  }
  else {
    uVar12 = 0;
    uVar11 = 0;
    do {
      ppVar7 = (lits->ebo_).buf;
      uVar15 = ppVar7[uVar11].first.rep_;
      uVar14 = ppVar7[uVar11].second;
      uVar4 = uVar15 & 0xfffffffe;
      ppVar7[uVar11].first.rep_ = uVar4;
      puVar2 = (s->assign_).assign_.ebo_.buf;
      if ((uVar14 == 0) || (puVar2[uVar15 >> 2] < 0x10 && (puVar2[uVar15 >> 2] & 3) != 0)) {
        if ((byte)((byte)puVar2[uVar15 >> 2] & 3) != (byte)(2U - ((uVar15 & 2) == 0))) {
          uVar14 = 0;
        }
        bound = bound - uVar14;
      }
      else {
        if ((int)uVar14 < 0) {
          uVar15 = -uVar14;
          ppVar7[uVar11].second = uVar15;
          uVar4 = uVar4 ^ 2;
          ppVar7[uVar11].first.rep_ = uVar4;
          if ((-1 < bound) && ((bound ^ 0x7fffffffU) < uVar15)) {
            exp = "bound < 0 || (MAX_W-bound) >= lits[i].second";
            fmt = "bound out of range";
            iVar8 = -2;
            uVar11 = 0x38;
            goto LAB_001794a3;
          }
          bound = bound - uVar14;
          uVar14 = uVar15;
        }
        uVar5 = (ulong)uVar12;
        uVar16 = uVar4 >> 2;
        uVar15 = *(uint *)((long)puVar2 + (ulong)(uVar4 & 0xfffffffc));
        if ((uVar15 & 0xc) == 0) {
          if (uVar11 != uVar12) {
            ppVar7[uVar5].first.rep_ = uVar4;
            ppVar7[uVar5].second = uVar14;
            uVar15 = puVar2[uVar16];
          }
          puVar2[uVar16] = (uVar4 & 2) * 2 + 4 | uVar15;
          uVar12 = uVar12 + 1;
        }
        else if ((uVar15 & (uint)((uVar4 & 2) == 0) * 4 + 4) == 0) {
          if (uVar12 == 0) {
            uVar5 = 0;
          }
          else {
            uVar9 = 0;
            do {
              if ((ppVar7[uVar9].first.rep_ ^ uVar4) < 2) {
                uVar5 = uVar9 & 0xffffffff;
                break;
              }
              uVar9 = uVar9 + 1;
            } while (uVar12 != (uint)uVar9);
          }
          ppVar7[uVar5].second = ppVar7[uVar5].second + uVar14;
        }
        else {
          uVar10 = 0;
          uVar9 = uVar10;
          if (uVar12 != 0) {
            do {
              uVar9 = uVar10;
              if ((ppVar7[uVar10].first.rep_ ^ uVar4 ^ 2) < 2) break;
              uVar10 = uVar10 + 1;
              uVar9 = uVar5;
            } while (uVar5 != uVar10);
          }
          bound = bound - uVar14;
          ppVar7 = ppVar7 + (uVar9 & 0xffffffff);
          iVar8 = ppVar7->second - uVar14;
          ppVar7->second = iVar8;
          if (iVar8 < 0) {
            (ppVar7->first).rep_ = uVar4;
            ppVar7->second = -iVar8;
            puVar2[uVar16] = (puVar2[uVar16] & 0xfffffff3) + (uVar4 & 2) * 2 + 4;
            bound = bound + ppVar7->second;
          }
          else if (iVar8 == 0) {
            *(byte *)(puVar2 + uVar16) = (byte)puVar2[uVar16] & 0xf3;
            memmove(ppVar7,ppVar7 + 1,(ulong)(~(uint)uVar9 + uVar12) << 3);
            uVar12 = uVar12 - 1;
          }
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != (lits->ebo_).size);
    ppVar6 = (lits->ebo_).buf;
    (lits->ebo_).size = uVar12;
    uVar11 = 1;
    uVar15 = 1;
    if (1 < bound) {
      uVar15 = bound;
    }
    if (uVar12 == 0) goto LAB_001793ec;
    puVar2 = (s->assign_).assign_.ebo_.buf;
    uVar14 = 0x7fffffff;
    uVar5 = 0;
    uVar12 = 0;
    do {
      puVar1 = (uint *)((long)puVar2 + (ulong)(ppVar6[uVar5].first.rep_ & 0xfffffffc));
      *puVar1 = *puVar1 & 0xfffffff3;
      uVar4 = ppVar6[uVar5].second;
      if ((int)uVar11 < (int)uVar4) {
        if ((int)uVar15 < (int)uVar4) {
          uVar4 = uVar15;
        }
        ppVar6[uVar5].second = uVar4;
        uVar11 = uVar4;
      }
      auVar3 = _DAT_001ac1c0;
      if ((int)(uVar12 ^ 0x7fffffff) < (int)uVar4) {
        exp = "(MAX_W - sumW) >= lits[i].second";
        fmt = "Sum of weights out of range";
        iVar8 = 0x4b;
        uVar11 = 0x62;
LAB_001794a3:
        Potassco::fail(iVar8,
                       "static WeightLitsRep Clasp::WeightLitsRep::create(Solver &, WeightLitVec &, weight_t)"
                       ,uVar11,exp,fmt,0);
      }
      if ((int)uVar4 < (int)uVar14) {
        uVar14 = uVar4;
      }
      uVar12 = uVar12 + uVar4;
      sVar13 = (int)uVar5 + 1;
      uVar5 = (ulong)sVar13;
    } while (sVar13 != (lits->ebo_).size);
    if (uVar11 != uVar14) {
      if (sVar13 != 0) {
        __last = ppVar6 + uVar5;
        std::_Temporary_buffer<std::pair<Clasp::Literal,_int>_*,_std::pair<Clasp::Literal,_int>_>::
        _Temporary_buffer(&local_48,ppVar6,uVar5 + 1 >> 1);
        if (local_48._M_buffer == (pair<Clasp::Literal,_int> *)0x0) {
          std::
          __inplace_stable_sort<std::pair<Clasp::Literal,int>*,__gnu_cxx::__ops::_Iter_comp_iter<Clasp::compose_2_2<std::greater<int>,Clasp::select2nd<std::pair<Clasp::Literal,int>>,Clasp::select2nd<std::pair<Clasp::Literal,int>>>>>
                    (ppVar6,__last,
                     (_Iter_comp_iter<Clasp::compose_2_2<std::greater<int>,_Clasp::select2nd<std::pair<Clasp::Literal,_int>_>,_Clasp::select2nd<std::pair<Clasp::Literal,_int>_>_>_>
                      )SUB83(__last,0));
        }
        else {
          std::
          __stable_sort_adaptive<std::pair<Clasp::Literal,int>*,std::pair<Clasp::Literal,int>*,long,__gnu_cxx::__ops::_Iter_comp_iter<Clasp::compose_2_2<std::greater<int>,Clasp::select2nd<std::pair<Clasp::Literal,int>>,Clasp::select2nd<std::pair<Clasp::Literal,int>>>>>
                    (ppVar6,__last,local_48._M_buffer,local_48._M_len,
                     (_Iter_comp_iter<Clasp::compose_2_2<std::greater<int>,_Clasp::select2nd<std::pair<Clasp::Literal,_int>_>,_Clasp::select2nd<std::pair<Clasp::Literal,_int>_>_>_>
                      )SUB83(__last,0));
        }
        operator_delete(local_48._M_buffer);
        sVar13 = (lits->ebo_).size;
        goto LAB_00179474;
      }
      goto LAB_001793ef;
    }
    if (uVar14 != 1) {
      bound = (int)(uVar14 + bound + -1) / (int)uVar14;
      uVar12 = (int)(uVar14 + uVar12 + -1) / (int)uVar14;
      if (sVar13 == 0) goto LAB_001793ef;
      lVar19 = uVar5 - 1;
      auVar17._8_4_ = (int)lVar19;
      auVar17._0_8_ = lVar19;
      auVar17._12_4_ = (int)((ulong)lVar19 >> 0x20);
      uVar9 = 0;
      auVar17 = auVar17 ^ _DAT_001ac1c0;
      auVar18 = _DAT_001ac1a0;
      auVar20 = _DAT_001ac1b0;
      do {
        auVar21 = auVar20 ^ auVar3;
        iVar8 = auVar17._4_4_;
        if ((bool)(~(auVar21._4_4_ == iVar8 && auVar17._0_4_ < auVar21._0_4_ ||
                    iVar8 < auVar21._4_4_) & 1)) {
          ppVar6[uVar9].second = 1;
        }
        if ((auVar21._12_4_ != auVar17._12_4_ || auVar21._8_4_ <= auVar17._8_4_) &&
            auVar21._12_4_ <= auVar17._12_4_) {
          ppVar6[uVar9 + 1].second = 1;
        }
        auVar21 = auVar18 ^ auVar3;
        iVar22 = auVar21._4_4_;
        if (iVar22 <= iVar8 && (iVar22 != iVar8 || auVar21._0_4_ <= auVar17._0_4_)) {
          ppVar6[uVar9 + 2].second = 1;
          ppVar6[uVar9 + 3].second = 1;
        }
        uVar9 = uVar9 + 4;
        lVar19 = auVar20._8_8_;
        auVar20._0_8_ = auVar20._0_8_ + 4;
        auVar20._8_8_ = lVar19 + 4;
        lVar19 = auVar18._8_8_;
        auVar18._0_8_ = auVar18._0_8_ + 4;
        auVar18._8_8_ = lVar19 + 4;
      } while ((uVar5 + 3 & 0xfffffffffffffffc) != uVar9);
    }
LAB_00179474:
    if (sVar13 != 0) {
      ppVar7 = (lits->ebo_).buf;
      goto LAB_001793f3;
    }
  }
  ppVar7 = (pointer)0x0;
LAB_001793f3:
  __return_storage_ptr__->lits = ppVar7;
  __return_storage_ptr__->size = sVar13;
  __return_storage_ptr__->bound = bound;
  __return_storage_ptr__->reach = uVar12;
  return __return_storage_ptr__;
}

Assistant:

WeightLitsRep WeightLitsRep::create(Solver& s, WeightLitVec& lits, weight_t bound) {
	// Step 0: Ensure s has all relevant problem variables
	if (s.numProblemVars() > s.numVars() && !lits.empty()) {
		s.acquireProblemVar(std::max_element(lits.begin(), lits.end())->first.var());
	}
	// Step 1: remove assigned/superfluous literals and merge duplicate/complementary ones
	LitVec::size_type j = 0, other;
	const weight_t MAX_W= std::numeric_limits<weight_t>::max();
	for (LitVec::size_type i = 0; i != lits.size(); ++i) {
		Literal x = lits[i].first.unflag();
		if (lits[i].second != 0 && s.topValue(x.var()) == value_free) {
			if (lits[i].second < 0) {
				lits[i].second = -lits[i].second;
				lits[i].first  = x = ~lits[i].first;
				POTASSCO_REQUIRE(bound < 0 || (MAX_W-bound) >= lits[i].second, "bound out of range");
				bound         += lits[i].second;
			}
			if (!s.seen(x.var())) { // first time we see x, keep and mark x
				if (i != j) lits[j] = lits[i];
				s.markSeen(x);
				++j;
			}
			else if (!s.seen(~x)) { // multi-occurrences of x, merge
				for (other = 0; other != j && lits[other].first != x; ++other) { ; }
				lits[other].second += lits[i].second;
			}
			else {                  // complementary literals ~x x
				for (other = 0; other != j && lits[other].first != ~x; ++other) { ; }
				bound              -= lits[i].second; // decrease by min(w(~x), w(x)) ; assume w(~x) > w(x)
				lits[other].second -= lits[i].second; // keep ~x,
				if (lits[other].second < 0) {         // actually, w(x) > w(~x),
					lits[other].first  = x;             // replace ~x with x
					lits[other].second = -lits[other].second;
					s.clearSeen(x.var());
					s.markSeen(x);
					bound += lits[other].second;        // and correct the bound
				}
				else if (lits[other].second == 0) {   // w(~x) == w(x) - drop both lits
					s.clearSeen(x.var());
					std::memmove(&lits[0]+other, &lits[0]+other+1, (j-other-1)*sizeof(lits[other]));
					--j;
				}
			}
		}
		else if (s.isTrue(x)) { bound -= lits[i].second; }
	}
	lits.erase(lits.begin()+j, lits.end());
	// Step 2: compute min,max, achievable weight and clear flags set in step 1
	weight_t sumW = 0;
	weight_t minW = MAX_W, maxW = 1;
	weight_t B    = std::max(bound, 1);
	for (LitVec::size_type i = 0; i != lits.size(); ++i) {
		assert(lits[i].second > 0);
		s.clearSeen(lits[i].first.var());
		if (lits[i].second > maxW) { maxW = lits[i].second = std::min(lits[i].second, B);  }
		if (lits[i].second < minW) { minW = lits[i].second; }
		POTASSCO_CHECK((MAX_W - sumW) >= lits[i].second, EOVERFLOW, "Sum of weights out of range");
		sumW += lits[i].second;
	}
	// Step 3: sort by decreasing weight
	if (maxW != minW) {
		std::stable_sort(lits.begin(), lits.end(), compose22(
			std::greater<weight_t>(),
			select2nd<WeightLiteral>(),
			select2nd<WeightLiteral>()));
	}
	else if (minW != 1) {
		// disguised cardinality constraint
		bound = (bound+(minW-1))/minW;
		sumW  = (sumW+(minW-1))/minW;
		for (LitVec::size_type i = 0; i != lits.size(); ++i) { lits[i].second = 1; }
	}
	WeightLitsRep result = { !lits.empty() ? &lits[0] : 0, (uint32)lits.size(), bound, sumW };
	return result;
}